

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lecturedemotwonorm.cc
# Opt level: O0

double lecturedemo::l2normByMeshFunction
                 (shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *fe_space,VectorXd *uvec)

{
  element_type *peVar1;
  element_type *mesh;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>_>
  __x;
  double dVar2;
  PredicateTrue local_a1;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
  local_a0;
  shared_ptr<const_lf::mesh::Mesh> local_78 [2];
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  shared_ptr<const_lf::fe::ScalarFESpace<double>_> local_48;
  undefined1 local_38 [8];
  MeshFunctionFE<double,_double> mf_fe;
  VectorXd *uvec_local;
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>_> *fe_space_local;
  
  mf_fe.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = (Index)uvec;
  std::shared_ptr<lf::fe::ScalarFESpace<double>const>::
  shared_ptr<lf::uscalfe::UniformScalarFESpace<double>,void>
            ((shared_ptr<lf::fe::ScalarFESpace<double>const> *)&local_48,fe_space);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_58,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             mf_fe.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows);
  lf::fe::MeshFunctionFE<double,_double>::MeshFunctionFE
            ((MeshFunctionFE<double,_double> *)local_38,&local_48,&local_58);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_58);
  std::shared_ptr<const_lf::fe::ScalarFESpace<double>_>::~shared_ptr(&local_48);
  peVar1 = std::
           __shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)fe_space);
  (**(peVar1->super_ScalarFESpace<double>)._vptr_ScalarFESpace)(local_78);
  mesh = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_78);
  lf::mesh::utils::squaredNorm<lf::fe::MeshFunctionFE<double,_double>_>
            (&local_a0,(MeshFunctionFE<double,_double> *)local_38);
  __x = lf::fe::
        IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>,_lf::base::PredicateTrue>
                  (mesh,&local_a0,2,&local_a1,0);
  dVar2 = sqrt(__x);
  lf::mesh::utils::
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::fe::MeshFunctionFE<double,_double>_>
  ::~MeshFunctionUnary(&local_a0);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(local_78);
  lf::fe::MeshFunctionFE<double,_double>::~MeshFunctionFE
            ((MeshFunctionFE<double,_double> *)local_38);
  return dVar2;
}

Assistant:

double l2normByMeshFunction(
    const std::shared_ptr<lf::uscalfe::UniformScalarFESpace<double>> &fe_space,
    const Eigen::VectorXd &uvec) {
  // Compute norms of finite element function by means of numerical quadrature
  // which is exact for piecewise quadratic polynomials (degree of exactness 2)
  auto mf_fe = lf::fe::MeshFunctionFE<double, double>(fe_space, uvec);
  return std::sqrt(lf::fe::IntegrateMeshFunction(
      *fe_space->Mesh(), lf::mesh::utils::squaredNorm(mf_fe), 2));
}